

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

void __thiscall TSMuxer::addData(TSMuxer *this,uint8_t pesStreamID,int pid,AVPacket *avPacket)

{
  byte bVar1;
  pointer puVar2;
  pointer ppVar3;
  undefined4 *puVar4;
  pointer puVar5;
  int iVar6;
  size_t sVar7;
  int iVar8;
  int beforePesLen;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ostringstream ss;
  
  sVar7 = (this->m_pesData).m_size;
  iVar8 = (int)sVar7;
  iVar6 = iVar8;
  beforePesLen = iVar8;
  if (sVar7 == 0) {
    buildPesHeader(this,pesStreamID,avPacket,(int)avPacket);
    this->m_pesPID = pid;
    bVar1 = (byte)avPacket->flags;
    this->m_pesIFrame = (bool)(bVar1 >> 3 & 1);
    this->m_pesSpsPps = (bool)(bVar1 >> 5 & 1);
    sVar7 = (this->m_pesData).m_size;
    iVar6 = (int)sVar7;
  }
  if (iVar6 < 0x5f5e101) {
    MemoryBlock::grow(&this->m_pesData,(long)avPacket->size);
    puVar2 = (this->m_pesData).m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (pointer)0x0;
    if (puVar2 != (this->m_pesData).m_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      puVar5 = puVar2;
    }
    memcpy(puVar5 + (int)sVar7,avPacket->data,(long)avPacket->size);
    if ((avPacket->flags & 0x10) != 0) {
      ppVar3 = (this->m_priorityData).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (((this->m_priorityData).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start == ppVar3) ||
         (ppVar3[-1].first + ppVar3[-1].second != iVar8)) {
        _ss = (iVar6 - iVar8) + avPacket->size;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   &this->m_priorityData,&beforePesLen,(int *)&ss);
      }
      else {
        ppVar3[-1].second = ppVar3[-1].second + (iVar6 - iVar8) + avPacket->size;
      }
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  std::operator<<((ostream *)&ss,
                  "Pes packet len too large ( >100Mb). Bad stream or invalid codec speciffed.");
  puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar4 = 3;
  *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
  if (local_1c8 == &local_1b8) {
    puVar4[6] = local_1b8;
    puVar4[7] = uStack_1b4;
    puVar4[8] = uStack_1b0;
    puVar4[9] = uStack_1ac;
  }
  else {
    *(uint **)(puVar4 + 2) = local_1c8;
    *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1b4,local_1b8);
  }
  *(undefined8 *)(puVar4 + 4) = local_1c0;
  local_1c0 = 0;
  local_1b8 = local_1b8 & 0xffffff00;
  local_1c8 = &local_1b8;
  __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void TSMuxer::addData(const uint8_t pesStreamID, const int pid, AVPacket& avPacket)
{
    int beforePesLen = static_cast<int>(m_pesData.size());
    if (m_pesData.size() == 0)
    {
        buildPesHeader(pesStreamID, avPacket, pid);
        m_pesPID = pid;
        m_pesIFrame = avPacket.flags & AVPacket::IS_IFRAME;
        m_pesSpsPps = avPacket.flags & AVPacket::IS_SPS_PPS_IN_GOP;
    }
    const int oldLen = static_cast<int>(m_pesData.size());
    const int pesHeaderLen = oldLen - beforePesLen;
    if (oldLen > 100000000)
        THROW(ERR_COMMON, "Pes packet len too large ( >100Mb). Bad stream or invalid codec speciffed.")
    m_pesData.grow(avPacket.size /*+ additionDataSize*/);
    uint8_t* dst = m_pesData.data() + oldLen;
    // memcpy(dst, tmpBuffer, additionDataSize);
    memcpy(dst /*+ additionDataSize*/, avPacket.data, avPacket.size);
    if (avPacket.flags & AVPacket::PRIORITY_DATA)
    {
        if (!m_priorityData.empty() && m_priorityData.rbegin()->first + m_priorityData.rbegin()->second == beforePesLen)
            m_priorityData.rbegin()->second += avPacket.size + pesHeaderLen;
        else
            m_priorityData.emplace_back(beforePesLen, avPacket.size + pesHeaderLen);
    }
}